

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mod.c
# Opt level: O0

void ppSqrMod(word *b,word *a,word *mod,size_t n,void *stack)

{
  size_t in_RCX;
  word *in_RSI;
  word *in_R8;
  word *sqr;
  
  ppSqr(in_R8,in_RSI,in_RCX,in_R8 + in_RCX * 2);
  ppMod(b,a,(size_t)mod,(word *)n,(size_t)stack,sqr);
  return;
}

Assistant:

void ppSqrMod(word b[], const word a[], const word mod[], size_t n,
	void* stack)
{
	word* sqr = (word*)stack;
	stack = sqr + 2 * n;
	// pre
	ASSERT(wwCmp(a, mod, n) < 0);
	ASSERT(n > 0 && mod[n - 1] != 0);
	ASSERT(wwIsValid(b, n));
	// вычисления
	ppSqr(sqr, a, n, stack);
	ppMod(b, sqr, 2 * n, mod, n, stack);
}